

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc_booke.c
# Opt level: O2

void store_booke_tcr_ppc(CPUPPCState_conflict *env,target_ulong val)

{
  env->spr[0x154] = (target_ulong_conflict)val;
  booke_update_irq((PowerPCCPU_conflict1 *)&env[-1].spr_cb[0x1b7].hea_write);
  return;
}

Assistant:

void store_booke_tcr(CPUPPCState *env, target_ulong val)
{
    PowerPCCPU *cpu = env_archcpu(env);
    ppc_tb_t *tb_env = env->tb_env;
    booke_timer_t *booke_timer = tb_env->opaque;

    env->spr[SPR_BOOKE_TCR] = val;
    // kvmppc_set_tcr(cpu);

    booke_update_irq(cpu);

    booke_update_fixed_timer(env,
                             booke_get_fit_target(env, tb_env),
                             &booke_timer->fit_next,
                             booke_timer->fit_timer,
                             TSR_FIS);

    booke_update_fixed_timer(env,
                             booke_get_wdt_target(env, tb_env),
                             &booke_timer->wdt_next,
                             booke_timer->wdt_timer,
                             TSR_WIS);
}